

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_serialize_container
          (t_cpp_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  t_cpp_generator *this_00;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string iter;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "xfer += oprot->writeSetBegin(";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"xfer += oprot->writeSetBegin(",0x1d);
      type_to_enum_abi_cxx11_
                (&local_130,(t_cpp_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"static_cast<uint32_t>(",0x16);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".size()));",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_001a9722;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "xfer += oprot->writeListBegin(";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"xfer += oprot->writeListBegin(",0x1e);
      type_to_enum_abi_cxx11_
                (&local_130,(t_cpp_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"static_cast<uint32_t>(",0x16);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".size()));",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_001a9722;
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar3 = "xfer += oprot->writeMapBegin(";
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"xfer += oprot->writeMapBegin(",0x1d);
    type_to_enum_abi_cxx11_
              (&local_130,(t_cpp_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_130._M_dataplus._M_p,local_130._M_string_length);
    this_00 = (t_cpp_generator *)0x3a9be2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    type_to_enum_abi_cxx11_(&local_110,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_110._M_dataplus._M_p,local_110._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"static_cast<uint32_t>(",0x16);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".size()));",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
LAB_001a9722:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_iter","");
  t_generator::tmp(&local_130,(t_generator *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_110._M_dataplus._M_p,local_110._M_string_length);
  type_name_abi_cxx11_(&local_70,this,ttype,false,false);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"::const_iterator ",0x11);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"for (",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".begin(); ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".end(); ++",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      paVar5 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_130._M_dataplus._M_p,
                 local_130._M_dataplus._M_p + local_130._M_string_length);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_d0);
      _Var4._M_p = local_d0._M_dataplus._M_p;
      goto LAB_001a9a80;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      paVar5 = &local_f0.field_2;
      local_f0._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_130._M_dataplus._M_p,
                 local_130._M_dataplus._M_p + local_130._M_string_length);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_f0);
      _Var4._M_p = local_f0._M_dataplus._M_p;
      goto LAB_001a9a80;
    }
  }
  else {
    paVar5 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_b0);
    _Var4._M_p = local_b0._M_dataplus._M_p;
LAB_001a9a80:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar5) {
      operator_delete(_Var4._M_p);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar1 == '\0') goto LAB_001a9b3f;
      poVar2 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"xfer += oprot->writeListEnd();",0x1e);
    }
    else {
      poVar2 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"xfer += oprot->writeSetEnd();",0x1d);
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"xfer += oprot->writeMapEnd();",0x1d);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_001a9b3f:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    indent(out) << "xfer += oprot->writeMapBegin(" << type_to_enum(((t_map*)ttype)->get_key_type())
                << ", " << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "xfer += oprot->writeSetBegin(" << type_to_enum(((t_set*)ttype)->get_elem_type())
                << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "xfer += oprot->writeListBegin("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  }

  string iter = tmp("_iter");
  out << indent() << type_name(ttype) << "::const_iterator " << iter << ";" << endl << indent()
      << "for (" << iter << " = " << prefix << ".begin(); " << iter << " != " << prefix
      << ".end(); ++" << iter << ")" << endl;
  scope_up(out);
  if (ttype->is_map()) {
    generate_serialize_map_element(out, (t_map*)ttype, iter);
  } else if (ttype->is_set()) {
    generate_serialize_set_element(out, (t_set*)ttype, iter);
  } else if (ttype->is_list()) {
    generate_serialize_list_element(out, (t_list*)ttype, iter);
  }
  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "xfer += oprot->writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "xfer += oprot->writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "xfer += oprot->writeListEnd();" << endl;
  }

  scope_down(out);
}